

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cc
# Opt level: O0

uintm __thiscall ParserContext::getContextBits(ParserContext *this,int4 startbit,int4 size)

{
  int iVar1;
  int iVar2;
  uintm res2;
  int4 remaining;
  int4 unusedBits;
  int4 bitOffset;
  uintm res;
  int4 intstart;
  int4 size_local;
  int4 startbit_local;
  ParserContext *this_local;
  
  iVar2 = (int)((ulong)(long)startbit >> 5);
  unusedBits = (this->context[iVar2] << (sbyte)(startbit & 0x1fU)) >> (0x20U - (char)size & 0x1f);
  iVar1 = size + -0x20 + (startbit & 0x1fU);
  if ((0 < iVar1) && (iVar2 = iVar2 + 1, iVar2 < this->contextsize)) {
    unusedBits = this->context[iVar2] >> (0x20U - (char)iVar1 & 0x1f) | unusedBits;
  }
  return unusedBits;
}

Assistant:

uintm ParserContext::getContextBits(int4 startbit,int4 size) const

{
  int4 intstart = startbit / (8*sizeof(uintm));
  uintm res = context[ intstart ]; // Get intm containing highest bit
  int4 bitOffset = startbit % (8*sizeof(uintm));
  int4 unusedBits = 8*sizeof(uintm) - size;
  res <<= bitOffset;	// Shift startbit to highest position
  res >>= unusedBits;
  int4 remaining = size - 8*sizeof(uintm) + bitOffset;
  if ((remaining > 0) && (++intstart < contextsize)) {
    uintm res2 = context[ intstart ];
    unusedBits = 8*sizeof(uintm) - remaining;
    res2 >>= unusedBits;
    res |= res2;
  }
  return res;
}